

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int sparse_list_add(pax *pax,int64_t offset,int64_t length)

{
  int iVar1;
  int64_t in_RDX;
  pax *in_RSI;
  long in_RDI;
  int r;
  int64_t last_offset;
  int in_stack_ffffffffffffffd4;
  long length_00;
  
  if (*(long *)(in_RDI + 0x68) == 0) {
    length_00 = 0;
  }
  else {
    length_00 = *(long *)(*(long *)(in_RDI + 0x68) + 0x10) +
                *(long *)(*(long *)(in_RDI + 0x68) + 0x18);
  }
  if (length_00 < (long)in_RSI) {
    iVar1 = _sparse_list_add_block(in_RSI,in_RDX,length_00,in_stack_ffffffffffffffd4);
    if (iVar1 != 0) {
      return iVar1;
    }
    in_stack_ffffffffffffffd4 = 0;
  }
  iVar1 = _sparse_list_add_block(in_RSI,in_RDX,length_00,in_stack_ffffffffffffffd4);
  return iVar1;
}

Assistant:

static int
sparse_list_add(struct pax *pax, int64_t offset, int64_t length)
{
	int64_t last_offset;
	int r;

	if (pax->sparse_tail == NULL)
		last_offset = 0;
	else {
		last_offset = pax->sparse_tail->offset +
		    pax->sparse_tail->remaining;
	}
	if (last_offset < offset) {
		/* Add a hole block. */
		r = _sparse_list_add_block(pax, last_offset,
		    offset - last_offset, 1);
		if (r != ARCHIVE_OK)
			return (r);
	}
	/* Add data block. */
	return (_sparse_list_add_block(pax, offset, length, 0));
}